

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O3

iter_result * __thiscall
unodb::detail::
basic_inode_48<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
::begin(basic_inode_48<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
        *this)

{
  long lVar1;
  long extraout_RAX;
  iter_result *in_RDI;
  
  lVar1 = 0;
  do {
    if ((this->child_indexes)._M_elems[lVar1].value.super___atomic_base<unsigned_char>._M_i != 0xff)
    goto LAB_00158d0d;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x100);
  basic_inode_48<unodb::detail::basic_art_policy<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::olc_db,unodb::in_critical_section,unodb::optimistic_lock,unodb::optimistic_lock::read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,unodb::detail::olc_inode_defs,unodb::detail::db_inode_qsbr_deleter,unodb::detail::db_leaf_qsbr_deleter>>
  ::begin();
  lVar1 = extraout_RAX;
LAB_00158d0d:
  (in_RDI->node).tagged_ptr = (ulong)this | 3;
  in_RDI->key_byte = (byte)lVar1;
  in_RDI->child_index = (byte)lVar1;
  in_RDI->prefix = *(key_prefix_snapshot *)&this->field_0x18;
  return in_RDI;
}

Assistant:

[[nodiscard, gnu::pure]] constexpr typename basic_inode_48::iter_result
  begin() noexcept {
    for (std::uint64_t i = 0; i < 256; i++) {
      if (child_indexes[i] != empty_child) {
        const auto key = static_cast<std::byte>(i);
        const auto child_index = static_cast<std::uint8_t>(i);
        return {node_ptr{this, node_type::I48}, key, child_index,
                this->get_key_prefix().get_snapshot()};
      }
    }
    // because we always have at least 17 keys.
    UNODB_DETAIL_CANNOT_HAPPEN();  // LCOV_EXCL_LINE
  }